

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O0

void __thiscall
InterpGCTest_Collect_Basic_Test::InterpGCTest_Collect_Basic_Test
          (InterpGCTest_Collect_Basic_Test *this)

{
  InterpGCTest_Collect_Basic_Test *this_local;
  
  InterpGCTest::InterpGCTest(&this->super_InterpGCTest);
  (this->super_InterpGCTest).super_InterpTest.super_Test._vptr_Test =
       (_func_int **)&PTR__InterpGCTest_Collect_Basic_Test_005c2b18;
  return;
}

Assistant:

TEST_F(InterpGCTest, Collect_Basic) {
  auto foreign = Foreign::New(store_, nullptr);
  auto after_new = store_.object_count();
  EXPECT_EQ(before_new + 1, after_new);

  // Remove root, but object is not destroyed until collect.
  foreign.reset();
  EXPECT_EQ(after_new, store_.object_count());
}